

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

bool parse_cpu_range(string *range,bool (*boolmask) [512])

{
  int iVar1;
  uint uVar2;
  long *__nptr;
  long lVar3;
  common_log *log;
  int *piVar4;
  ulong uVar5;
  undefined8 uVar6;
  char *fmt;
  bool bVar7;
  long *__nptr_00;
  ulonglong uVar8;
  long *local_60;
  bool (*local_58) [512];
  long *local_50 [2];
  long local_40 [2];
  
  lVar3 = std::__cxx11::string::find((char)range,0x2d);
  if (lVar3 == 0) {
    uVar5 = 0;
    local_58 = boolmask;
LAB_002047d1:
    uVar8 = 0x1ff;
    if (lVar3 != range->_M_string_length - 1) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)range);
      __nptr = local_50[0];
      range = (string *)__errno_location();
      uVar2 = *(uint *)&(range->_M_dataplus)._M_p;
      __nptr_00 = (long *)(ulong)uVar2;
      *(int *)&(range->_M_dataplus)._M_p = 0;
      uVar8 = strtoull((char *)__nptr,(char **)&local_60,10);
      if (local_60 == __nptr) {
LAB_002048e7:
        uVar6 = std::__throw_invalid_argument("stoull");
        if (*(int *)&(range->_M_dataplus)._M_p == 0) {
          *(int *)&(range->_M_dataplus)._M_p = (int)__nptr_00;
        }
        parse_cpu_range();
        _Unwind_Resume(uVar6);
      }
      iVar1 = *(int *)&(range->_M_dataplus)._M_p;
      if (iVar1 == 0) {
LAB_00204851:
        *(uint *)&(range->_M_dataplus)._M_p = uVar2;
      }
      else if (iVar1 == 0x22) {
        std::__throw_out_of_range("stoull");
        goto LAB_00204851;
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      if (0x1ff < uVar8) {
        if (common_log_verbosity_thold < 0) {
          return false;
        }
        log = common_log_main();
        fmt = "End index out of bounds!\n";
        goto LAB_00204890;
      }
    }
    bVar7 = true;
    if (uVar5 <= uVar8) {
      memset(*local_58 + uVar5,1,(uVar8 - uVar5) + 1);
    }
  }
  else {
    if (lVar3 == -1) {
      if (common_log_verbosity_thold < 0) {
        return false;
      }
      log = common_log_main();
      fmt = "Format of CPU range is invalid! Expected [<start>]-[<end>].\n";
    }
    else {
      local_58 = boolmask;
      std::__cxx11::string::substr((ulong)local_50,(ulong)range);
      __nptr_00 = local_50[0];
      piVar4 = __errno_location();
      iVar1 = *piVar4;
      *piVar4 = 0;
      uVar5 = strtoull((char *)__nptr_00,(char **)&local_60,10);
      if (local_60 == __nptr_00) {
        std::__throw_invalid_argument("stoull");
        goto LAB_002048e7;
      }
      if (*piVar4 == 0) {
LAB_00204784:
        *piVar4 = iVar1;
      }
      else if (*piVar4 == 0x22) {
        std::__throw_out_of_range("stoull");
        goto LAB_00204784;
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      if (uVar5 < 0x200) goto LAB_002047d1;
      if (common_log_verbosity_thold < 0) {
        return false;
      }
      log = common_log_main();
      fmt = "Start index out of bounds!\n";
    }
LAB_00204890:
    bVar7 = false;
    common_log_add(log,GGML_LOG_LEVEL_ERROR,fmt);
  }
  return bVar7;
}

Assistant:

bool parse_cpu_range(const std::string & range, bool (&boolmask)[GGML_MAX_N_THREADS]) {
    size_t dash_loc = range.find('-');
    if (dash_loc == std::string::npos) {
        LOG_ERR("Format of CPU range is invalid! Expected [<start>]-[<end>].\n");
        return false;
    }

    size_t start_i;
    size_t end_i;

    if (dash_loc == 0) {
        start_i = 0;
    } else {
        start_i = std::stoull(range.substr(0, dash_loc));
        if (start_i >= GGML_MAX_N_THREADS) {
            LOG_ERR("Start index out of bounds!\n");
            return false;
        }
    }

    if (dash_loc == range.length() - 1) {
        end_i = GGML_MAX_N_THREADS - 1;
    } else {
        end_i = std::stoull(range.substr(dash_loc + 1));
        if (end_i >= GGML_MAX_N_THREADS) {
            LOG_ERR("End index out of bounds!\n");
            return false;
        }
    }

    for (size_t i = start_i; i <= end_i; i++) {
        boolmask[i] = true;
    }

    return true;
}